

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iLimit;
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  U32 UVar7;
  size_t sVar8;
  BYTE *pBVar9;
  uint uVar10;
  int *piVar11;
  BYTE *pBVar12;
  int *piVar13;
  U32 UVar14;
  long lVar15;
  seqDef *psVar16;
  ulong uVar17;
  BYTE *pBVar18;
  uint uVar19;
  U32 UVar20;
  U32 UVar21;
  int *piVar22;
  ulong uVar23;
  U32 UVar24;
  U32 maxDistance;
  size_t ofbCandidate;
  size_t local_80;
  BYTE *local_78;
  BYTE *local_70;
  int *local_68;
  uint local_5c;
  int *local_58;
  int *local_50;
  BYTE *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  iLimit = (int *)((long)src + srcSize);
  local_68 = (int *)((long)src + (srcSize - 8));
  local_70 = (ms->window).base;
  local_48 = (ms->window).dictBase;
  uVar2 = (ms->window).dictLimit;
  local_78 = local_70 + uVar2;
  uVar5 = (ms->window).lowLimit;
  uVar10 = (ms->cParams).windowLog;
  uVar3 = (ms->cParams).minMatch;
  uVar19 = 6;
  if (uVar3 < 6) {
    uVar19 = uVar3;
  }
  local_5c = 4;
  if (4 < uVar19) {
    local_5c = uVar19;
  }
  UVar20 = *rep;
  UVar24 = rep[1];
  ms->lazySkipping = 0;
  piVar22 = (int *)((ulong)(local_78 == (BYTE *)src) + (long)src);
  local_40 = rep;
  if (piVar22 < local_68) {
    local_58 = (int *)(local_48 + uVar2);
    local_38 = local_48 + uVar5;
    uVar5 = 1 << ((byte)uVar10 & 0x1f);
    local_50 = iLimit + -8;
    do {
      pBVar18 = local_48;
      iVar6 = ((int)piVar22 - (int)local_70) + 1;
      UVar21 = (ms->window).lowLimit;
      UVar14 = iVar6 - uVar5;
      if (iVar6 - UVar21 <= uVar5) {
        UVar14 = UVar21;
      }
      if (ms->loadedDictEnd != 0) {
        UVar14 = UVar21;
      }
      uVar10 = iVar6 - UVar20;
      pBVar12 = local_70;
      if (uVar10 < uVar2) {
        pBVar12 = local_48;
      }
      piVar13 = (int *)((long)piVar22 + 1);
      if ((((uVar2 - 1) - uVar10 < 3) || (iVar6 - UVar14 < UVar20)) ||
         (*piVar13 != *(int *)(pBVar12 + uVar10))) {
        local_80 = 999999999;
        if (local_5c == 6) {
          uVar17 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar22,(BYTE *)iLimit,&local_80);
        }
        else if (local_5c == 5) {
          uVar17 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar22,(BYTE *)iLimit,&local_80);
        }
        else {
          uVar17 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar22,(BYTE *)iLimit,&local_80);
        }
        uVar23 = local_80;
        piVar11 = piVar22;
        if (uVar17 == 0) {
          uVar23 = 1;
          piVar11 = piVar13;
        }
        piVar13 = piVar11;
        UVar21 = (U32)uVar23;
        if (3 < uVar17) {
          if (3 < local_80) {
            uVar23 = (long)piVar22 + (3 - (long)(local_70 + local_80));
            pBVar9 = local_78;
            pBVar12 = local_70;
            if ((uint)uVar23 < uVar2) {
              pBVar9 = local_38;
              pBVar12 = pBVar18;
            }
            if ((src < piVar22) && (uVar23 = uVar23 & 0xffffffff, pBVar9 < pBVar12 + uVar23)) {
              pBVar12 = pBVar12 + uVar23;
              do {
                piVar22 = (int *)((long)piVar13 + -1);
                pBVar12 = pBVar12 + -1;
                if ((*(BYTE *)piVar22 != *pBVar12) ||
                   (uVar17 = uVar17 + 1, piVar13 = piVar22, piVar22 <= src)) break;
              } while (pBVar9 < pBVar12);
            }
            UVar24 = UVar20;
            UVar20 = UVar21 - 3;
          }
          goto LAB_006dc69b;
        }
        uVar17 = (long)piVar22 - (long)src;
        piVar22 = (int *)((long)piVar22 + (uVar17 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar17);
      }
      else {
        piVar11 = iLimit;
        if (uVar10 < uVar2) {
          piVar11 = local_58;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar22 + 5),(BYTE *)((long)(pBVar12 + uVar10) + 4),
                           (BYTE *)iLimit,(BYTE *)piVar11,local_78);
        uVar17 = sVar8 + 4;
        UVar21 = 1;
LAB_006dc69b:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_006dca54:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_006dca35:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar23 = (long)piVar13 - (long)src;
        pBVar18 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar18 + uVar23) {
LAB_006dc9f7:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iLimit < piVar13) {
LAB_006dca16:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < piVar13) {
          ZSTD_safecopyLiterals(pBVar18,(BYTE *)src,(BYTE *)piVar13,(BYTE *)local_50);
LAB_006dc716:
          seqStore->lit = seqStore->lit + uVar23;
          if (0xffff < uVar23) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar18 = *src;
          *(undefined8 *)(pBVar18 + 8) = uVar4;
          pBVar18 = seqStore->lit;
          if (0x10 < uVar23) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar18 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar4 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar18 + 0x18) = uVar4;
            if (0x20 < (long)uVar23) {
              lVar15 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar15 + 0x20);
                uVar4 = puVar1[1];
                pBVar12 = pBVar18 + lVar15 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)src + lVar15 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar4;
                lVar15 = lVar15 + 0x20;
              } while (pBVar12 + 0x20 < pBVar18 + uVar23);
            }
            goto LAB_006dc716;
          }
          seqStore->lit = pBVar18 + uVar23;
        }
        psVar16 = seqStore->sequences;
        psVar16->litLength = (U16)uVar23;
        psVar16->offBase = UVar21;
        if (uVar17 < 3) {
LAB_006dca73:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar17 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_006dca92:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar16->mlBase = (U16)(uVar17 - 3);
        psVar16 = psVar16 + 1;
        seqStore->sequences = psVar16;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        piVar22 = (int *)((long)piVar13 + uVar17);
        src = piVar22;
        UVar21 = UVar24;
        if (piVar22 <= local_68) {
          do {
            UVar7 = UVar20;
            iVar6 = (int)piVar22 - (int)local_70;
            UVar20 = (ms->window).lowLimit;
            UVar14 = iVar6 - uVar5;
            if (iVar6 - UVar20 <= uVar5) {
              UVar14 = UVar20;
            }
            if (ms->loadedDictEnd != 0) {
              UVar14 = UVar20;
            }
            uVar10 = iVar6 - UVar21;
            pBVar18 = local_70;
            if (uVar10 < uVar2) {
              pBVar18 = local_48;
            }
            src = piVar22;
            UVar24 = UVar21;
            UVar20 = UVar7;
            if ((((uVar2 - 1) - uVar10 < 3) || (iVar6 - UVar14 < UVar21)) ||
               (*piVar22 != *(int *)(pBVar18 + uVar10))) break;
            piVar13 = iLimit;
            if (uVar10 < uVar2) {
              piVar13 = local_58;
            }
            sVar8 = ZSTD_count_2segments
                              ((BYTE *)(piVar22 + 1),(BYTE *)((long)(pBVar18 + uVar10) + 4),
                               (BYTE *)iLimit,(BYTE *)piVar13,local_78);
            if (seqStore->maxNbSeq <= (ulong)((long)psVar16 - (long)seqStore->sequencesStart >> 3))
            goto LAB_006dca54;
            if (0x20000 < seqStore->maxNbLit) goto LAB_006dca35;
            pBVar18 = seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < pBVar18) goto LAB_006dc9f7;
            if (iLimit < piVar22) goto LAB_006dca16;
            if (local_50 < piVar22) {
              ZSTD_safecopyLiterals(pBVar18,(BYTE *)piVar22,(BYTE *)piVar22,(BYTE *)local_50);
            }
            else {
              uVar4 = *(undefined8 *)(piVar22 + 2);
              *(undefined8 *)pBVar18 = *(undefined8 *)piVar22;
              *(undefined8 *)(pBVar18 + 8) = uVar4;
            }
            psVar16 = seqStore->sequences;
            psVar16->litLength = 0;
            psVar16->offBase = 1;
            if (sVar8 + 4 < 3) goto LAB_006dca73;
            if (0xffff < sVar8 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_006dca92;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar16->mlBase = (U16)(sVar8 + 1);
            psVar16 = psVar16 + 1;
            seqStore->sequences = psVar16;
            piVar22 = (int *)((long)piVar22 + sVar8 + 4);
            src = piVar22;
            UVar24 = UVar7;
            UVar20 = UVar21;
            UVar21 = UVar7;
          } while (piVar22 <= local_68);
        }
      }
    } while (piVar22 < local_68);
  }
  *local_40 = UVar20;
  local_40[1] = UVar24;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0);
}